

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  void *pvVar8;
  size_t sVar9;
  TiledOutputFile file;
  Header f;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long *local_80;
  long local_78;
  long local_70 [2];
  TileDescription local_60 [3];
  
  local_a8 = 0;
  Imf_3_4::Header::Header
            ((Header *)local_60,0x40,0x40,1.0,(Vec2 *)&local_a8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_a8,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar9 = *(size_t *)(filename + 8);
  if (sVar9 == DAT_001eafb0) {
    if (sVar9 != 0) {
      iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar2 != 0) goto LAB_00131393;
    }
  }
  else {
LAB_00131393:
    Imf_3_4::Header::setType((string *)local_60);
  }
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = 2;
  local_a8 = 0x2000000020;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Imf_3_4::Header::setTileDescription(local_60);
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)&local_a8,"/var/tmp/badfile.exr",(Header *)local_60,iVar2);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&local_a8);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_a8,"/var/tmp/badfile.exr",iVar2,true);
  sVar9 = inputtype->_M_string_length;
  iVar2 = (int)&local_a8;
  if (sVar9 == DAT_001eafb0) {
    if (sVar9 == 0) {
LAB_00131545:
      sVar9 = 0;
    }
    else {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar3 != 0) goto LAB_00131442;
    }
  }
  else {
LAB_00131442:
    Imf_3_4::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar9 = puVar6[1];
    if (sVar9 == inputtype->_M_string_length) {
      if (sVar9 == 0) goto LAB_00131545;
      iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar9);
      if (iVar3 == 0) goto LAB_001315c4;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                        inputtype->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
    Imf_3_4::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from multipart when input type was ",0x24);
    sVar9 = *(size_t *)(filename + 8);
    if (sVar9 == DAT_001eafb0) {
      if (sVar9 != 0) {
        pvVar8 = *(void **)filename;
        iVar3 = bcmp(pvVar8,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
        if (iVar3 != 0) goto LAB_0013154d;
      }
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unset","");
    }
    else {
      pvVar8 = *(void **)filename;
LAB_0013154d:
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,pvVar8,sVar9 + (long)pvVar8);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_80,local_78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    sVar9 = inputtype->_M_string_length;
  }
LAB_001315c4:
  if (sVar9 == DAT_001eafb0) {
    if (sVar9 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar3 != 0) goto LAB_001315e8;
    }
  }
  else {
LAB_001315e8:
    Imf_3_4::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar9 = puVar6[1];
    if (sVar9 != inputtype->_M_string_length) {
LAB_001318a6:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::TiledInputFile, OUT = Imf_3_4::TiledOutputFile]"
                   );
    }
    if (sVar9 != 0) {
      iVar2 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar9);
      if (iVar2 != 0) goto LAB_001318a6;
    }
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_a8,"/var/tmp/badfile.exr",iVar2);
  sVar9 = inputtype->_M_string_length;
  if (sVar9 == DAT_001eafb0) {
    if (sVar9 != 0) {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar2 != 0) goto LAB_00131681;
    }
    Imf_3_4::TiledInputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::TiledInputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::TiledInputFile, OUT = Imf_3_4::TiledOutputFile]"
                   );
    }
    goto LAB_00131861;
  }
LAB_00131681:
  Imf_3_4::TiledInputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar9 = puVar6[1];
  if (sVar9 == inputtype->_M_string_length) {
    if (sVar9 == 0) goto LAB_00131861;
    iVar2 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar9);
    if (iVar2 == 0) goto LAB_00131861;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_4::TiledInputFile::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar9 = *(size_t *)(filename + 8);
  if (sVar9 == DAT_001eafb0) {
    if (sVar9 != 0) {
      pvVar8 = *(void **)filename;
      iVar2 = bcmp(pvVar8,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar2 != 0) goto LAB_001317ee;
    }
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unset","");
  }
  else {
    pvVar8 = *(void **)filename;
LAB_001317ee:
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,pvVar8,sVar9 + (long)pvVar8);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_80,local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
LAB_00131861:
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header((Header *)local_60);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}